

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O3

uint lws_retry_get_delay_ms(lws_context *context,lws_retry_bo_t *retry,uint16_t *ctry,char *conceal)

{
  uint *puVar1;
  size_t sVar2;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint16_t ra;
  ushort local_2a;
  
  if (conceal != (char *)0x0) {
    *conceal = '\0';
  }
  if (retry == (lws_retry_bo_t *)0x0) {
    uVar6 = 0x1e;
    uVar5 = 3000;
  }
  else {
    if (*ctry < retry->retry_ms_table_count) {
      puVar1 = retry->retry_ms_table + *ctry;
    }
    else {
      puVar1 = retry->retry_ms_table + ((ulong)retry->retry_ms_table_count - 1);
    }
    uVar5 = *puVar1;
    uVar4 = 0x1e;
    if ((char)*(uint *)&retry->jitter_percent != '\0') {
      uVar4 = *(uint *)&retry->jitter_percent;
    }
    uVar6 = (ulong)(uVar4 & 0xff);
  }
  sVar2 = lws_get_random(context,&local_2a,2);
  if (sVar2 == 2) {
    if (*ctry == 0xffff) {
      uVar3 = 0xffff;
    }
    else {
      uVar3 = *ctry + 1;
      *ctry = uVar3;
    }
    if (conceal != (char *)0x0 && retry != (lws_retry_bo_t *)0x0) {
      *conceal = uVar3 <= retry->conceal_count;
    }
    return uVar5 + (int)((uVar6 * uVar5 * (ulong)local_2a) / 0x640000);
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/core-net/network.c"
                ,0x18c,
                "unsigned int lws_retry_get_delay_ms(struct lws_context *, const lws_retry_bo_t *, uint16_t *, char *)"
               );
}

Assistant:

unsigned int
lws_retry_get_delay_ms(struct lws_context *context,
		       const lws_retry_bo_t *retry, uint16_t *ctry,
		       char *conceal)
{
	uint64_t ms = 3000, pc = 30; /* sane-ish defaults if no retry table */
	uint16_t ra;

	if (conceal)
		*conceal = 0;

	if (retry) {
		if (*ctry < retry->retry_ms_table_count)
			ms = retry->retry_ms_table[*ctry];
		else
			ms = retry->retry_ms_table[
				retry->retry_ms_table_count - 1];

		/* if no percent given, use the default 30% */
		if (retry->jitter_percent)
			pc = retry->jitter_percent;
	}

	if (lws_get_random(context, &ra, sizeof(ra)) == sizeof(ra))
		ms += ((ms * pc * ra) >> 16) / 100;
	else
		assert(0);

	if (*ctry < 0xffff)
		(*ctry)++;

	if (retry && conceal)
		*conceal = (int)*ctry <= retry->conceal_count;

	return (unsigned int)ms;
}